

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O2

QString * qt_findAtNxFile(QString *__return_storage_ptr__,QString *baseFileName,
                         qreal targetDevicePixelRatio,qreal *sourceDevicePixelRatio)

{
  char16_t *pcVar1;
  Data *pDVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  qsizetype qVar7;
  QChar *pQVar8;
  int iVar9;
  long in_FS_OFFSET;
  double dVar10;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sourceDevicePixelRatio != (qreal *)0x0) {
    *sourceDevicePixelRatio = 1.0;
  }
  if (1.0 < targetDevicePixelRatio) {
    if ((qt_findAtNxFile(QString_const&,double,double*)::disableNxImageLoading == '\0') &&
       (iVar9 = __cxa_guard_acquire(&qt_findAtNxFile(QString_const&,double,double*)::
                                     disableNxImageLoading), iVar9 != 0)) {
      bVar4 = qEnvironmentVariableIsEmpty("QT_HIGHDPI_DISABLE_2X_IMAGE_LOADING");
      qt_findAtNxFile::disableNxImageLoading = (bool)(bVar4 ^ 1);
      __cxa_guard_release(&qt_findAtNxFile(QString_const&,double,double*)::disableNxImageLoading);
    }
    if (qt_findAtNxFile::disableNxImageLoading != true) {
      qVar7 = QString::lastIndexOf(baseFileName,(QChar)0x2e,CaseSensitive);
      uVar5 = (uint)qVar7;
      if (uVar5 == 0xffffffff) {
        uVar6 = (uint)(baseFileName->d).size;
      }
      else {
        uVar6 = uVar5;
        if (((1 < (int)uVar5) && (pcVar1 = (baseFileName->d).ptr, pcVar1[uVar5 - 1] == L'9')) &&
           (uVar6 = uVar5 - 2, pcVar1[uVar5 - 2] != L'.')) {
          uVar6 = uVar5;
        }
      }
      local_58.d = (baseFileName->d).d;
      local_58.ptr = (baseFileName->d).ptr;
      local_58.size = (baseFileName->d).size;
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::insert((longlong)&local_58,(QLatin1String *)(long)(int)uVar6);
      dVar10 = ceil(targetDevicePixelRatio);
      iVar9 = 9;
      if ((int)dVar10 < 9) {
        iVar9 = (int)dVar10;
      }
      for (; 1 < iVar9; iVar9 = iVar9 + -1) {
        pQVar8 = QString::data((QString *)&local_58);
        pQVar8[(long)((QLatin1String *)(long)(int)uVar6 + 1)].ucs = (short)iVar9 + 0x30U & 0xff;
        cVar3 = QFile::exists((QString *)&local_58);
        qVar7 = local_58.size;
        pcVar1 = local_58.ptr;
        pDVar2 = local_58.d;
        if (cVar3 != '\0') {
          if (sourceDevicePixelRatio != (qreal *)0x0) {
            *sourceDevicePixelRatio = (double)iVar9;
          }
          local_58.d = (Data *)0x0;
          local_58.ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).d = pDVar2;
          (__return_storage_ptr__->d).ptr = pcVar1;
          local_58.size = 0;
          (__return_storage_ptr__->d).size = qVar7;
          goto LAB_0025a8ba;
        }
      }
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&baseFileName->d);
LAB_0025a8ba:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_0025a8e6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&baseFileName->d);
    return __return_storage_ptr__;
  }
LAB_0025a8e6:
  __stack_chk_fail();
}

Assistant:

QString qt_findAtNxFile(const QString &baseFileName, qreal targetDevicePixelRatio,
                        qreal *sourceDevicePixelRatio)
{
    if (sourceDevicePixelRatio)
        *sourceDevicePixelRatio = 1;
    if (targetDevicePixelRatio <= 1.0)
        return baseFileName;

    static bool disableNxImageLoading = !qEnvironmentVariableIsEmpty("QT_HIGHDPI_DISABLE_2X_IMAGE_LOADING");
    if (disableNxImageLoading)
        return baseFileName;

    int dotIndex = baseFileName.lastIndexOf(u'.');
    if (dotIndex == -1) { /* no dot */
        dotIndex = baseFileName.size(); /* append */
    } else if (dotIndex >= 2 && baseFileName[dotIndex - 1] == u'9'
        && baseFileName[dotIndex - 2] == u'.') {
        // If the file has a .9.* (9-patch image) extension, we must ensure that the @nx goes before it.
        dotIndex -= 2;
    }

    QString atNxfileName = baseFileName;
    atNxfileName.insert(dotIndex, "@2x"_L1);
    // Check for @Nx, ..., @3x, @2x file versions,
    for (int n = qMin(qCeil(targetDevicePixelRatio), 9); n > 1; --n) {
        atNxfileName[dotIndex + 1] = QLatin1Char('0' + n);
        if (QFile::exists(atNxfileName)) {
            if (sourceDevicePixelRatio)
                *sourceDevicePixelRatio = n;
            return atNxfileName;
        }
    }

    return baseFileName;
}